

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::check_physical_type_cast
          (CompilerMSL *this,string *expr,SPIRType *type,uint32_t physical_type)

{
  BaseType BVar1;
  BaseType BVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  spirv_cross local_50 [32];
  SPIRType *local_30;
  SPIRType *p_physical_type;
  SPIRType *pSStack_20;
  uint32_t physical_type_local;
  SPIRType *type_local;
  string *expr_local;
  CompilerMSL *this_local;
  
  p_physical_type._4_4_ = physical_type;
  pSStack_20 = type;
  type_local = (SPIRType *)expr;
  expr_local = (string *)this;
  local_30 = Compiler::maybe_get<spirv_cross::SPIRType>((Compiler *)this,physical_type);
  if ((local_30 != (SPIRType *)0x0) && (local_30->storage == StorageClassPhysicalStorageBuffer)) {
    BVar1 = *(BaseType *)&(local_30->super_IVariant).field_0xc;
    BVar2 = to_unsigned_basetype(0x40);
    if (BVar1 == BVar2) {
      if (1 < local_30->vecsize) {
        ::std::__cxx11::string::operator+=((string *)type_local,".x");
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_70,this,pSStack_20,0);
      join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (local_50,(char (*) [3])0x5f4922,local_70,(char (*) [2])0x5eaa1a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
                 (char (*) [2])0x5eaa1a);
      ::std::__cxx11::string::operator=((string *)type_local,(string *)local_50);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void CompilerMSL::check_physical_type_cast(std::string &expr, const SPIRType *type, uint32_t physical_type)
{
	auto *p_physical_type = maybe_get<SPIRType>(physical_type);
	if (p_physical_type &&
		p_physical_type->storage == StorageClassPhysicalStorageBuffer &&
		p_physical_type->basetype == to_unsigned_basetype(64))
	{
		if (p_physical_type->vecsize > 1)
			expr += ".x";

		expr = join("((", type_to_glsl(*type), ")", expr, ")");
	}
}